

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O1

int __thiscall
CVmObjTemporaryFile::getp_getFilename
          (CVmObjTemporaryFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *str;
  int iVar1;
  vm_obj_id_t vVar2;
  
  if (getp_getFilename(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getFilename();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getFilename::desc);
  if (iVar1 == 0) {
    str = (this->super_CVmObject).ext_;
    if (*str == '\0') {
      retval->typ = VM_NIL;
    }
    else {
      vVar2 = CVmBif::str_from_ui_str(str);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar2;
    }
  }
  return 1;
}

Assistant:

int CVmObjTemporaryFile::getp_getFilename(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* if we have a filename, return it, otherwise return nil */
    vm_tmpfil_ext *ext = get_ext();
    if (ext->filename[0] != '\0')
    {
        /* return the filename */
        retval->set_obj(CVmBif::str_from_ui_str(vmg_ ext->filename));
    }
    else
    {
        /* no filename */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}